

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_rldinm(DisasContext_conflict10 *ctx,int mb,int me,int sh)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i64 ret;
  TCGv_i64 arg1;
  uint32_t uVar1;
  uint len_00;
  uint ofs;
  target_ulong arg2;
  int rsh;
  int len;
  TCGv_i64 t_rs;
  TCGv_i64 t_ra;
  TCGContext_conflict10 *tcg_ctx;
  int sh_local;
  int me_local;
  int mb_local;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = rA(ctx->opcode);
  ret = cpu_gpr[uVar1];
  uVar1 = rS(ctx->opcode);
  arg1 = cpu_gpr[uVar1];
  len_00 = (me - mb) + 1;
  ofs = 0x40U - sh & 0x3f;
  if (((sh == 0) || ((int)len_00 < 1)) || (me != 0x3f - sh)) {
    if ((me == 0x3f) && ((int)(ofs + len_00) < 0x41)) {
      tcg_gen_extract_i64_ppc64(tcg_ctx_00,ret,arg1,ofs,len_00);
    }
    else {
      tcg_gen_rotli_i64_ppc64(tcg_ctx_00,ret,arg1,sh);
      arg2 = MASK((long)mb,(long)me);
      tcg_gen_andi_i64_ppc64(tcg_ctx_00,ret,ret,arg2);
    }
  }
  else {
    tcg_gen_deposit_z_i64_ppc64(tcg_ctx_00,ret,arg1,sh,len_00);
  }
  uVar1 = Rc(ctx->opcode);
  if (uVar1 != 0) {
    gen_set_Rc0(ctx,ret);
  }
  return;
}

Assistant:

static void gen_rldinm(DisasContext *ctx, int mb, int me, int sh)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t_ra = cpu_gpr[rA(ctx->opcode)];
    TCGv t_rs = cpu_gpr[rS(ctx->opcode)];
    int len = me - mb + 1;
    int rsh = (64 - sh) & 63;

    if (sh != 0 && len > 0 && me == (63 - sh)) {
        tcg_gen_deposit_z_tl(tcg_ctx, t_ra, t_rs, sh, len);
    } else if (me == 63 && rsh + len <= 64) {
        tcg_gen_extract_tl(tcg_ctx, t_ra, t_rs, rsh, len);
    } else {
        tcg_gen_rotli_tl(tcg_ctx, t_ra, t_rs, sh);
        tcg_gen_andi_tl(tcg_ctx, t_ra, t_ra, MASK(mb, me));
    }
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, t_ra);
    }
}